

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

void sf::priv::InputImpl::setMousePosition(Vector2i *position)

{
  Display *display_00;
  undefined4 *in_RDI;
  Display *display;
  
  display_00 = OpenDisplay();
  XWarpPointer(display_00,0,
               *(undefined8 *)
                (*(long *)(display_00 + 0xe8) + (long)*(int *)(display_00 + 0xe0) * 0x80 + 0x10),0,0
               ,0,0,*in_RDI,in_RDI[1]);
  XFlush(display_00);
  CloseDisplay(display_00);
  return;
}

Assistant:

void InputImpl::setMousePosition(const Vector2i& position)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    XWarpPointer(display, None, DefaultRootWindow(display), 0, 0, 0, 0, position.x, position.y);
    XFlush(display);

    // Close the connection with the X server
    CloseDisplay(display);
}